

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

void ImStb::stb_textedit_discard_undo(StbUndoState *state)

{
  int iVar1;
  int *piVar2;
  short sVar3;
  long lVar4;
  
  sVar3 = state->undo_point;
  if (0 < sVar3) {
    if (-1 < state->undo_rec[0].char_storage) {
      iVar1 = state->undo_rec[0].insert_length;
      lVar4 = (long)state->undo_char_point - (long)iVar1;
      state->undo_char_point = (int)lVar4;
      memmove(state->undo_char,state->undo_char + iVar1,lVar4 * 2);
      piVar2 = &state->undo_rec[0].char_storage;
      for (lVar4 = 0; sVar3 = state->undo_point, lVar4 < sVar3; lVar4 = lVar4 + 1) {
        if (-1 < *piVar2) {
          *piVar2 = *piVar2 - iVar1;
        }
        piVar2 = piVar2 + 4;
      }
    }
    state->undo_point = sVar3 + -1;
    memmove(state,state->undo_rec + 1,(long)(short)(sVar3 + -1) << 4);
    return;
  }
  return;
}

Assistant:

static void stb_textedit_discard_undo(StbUndoState *state)
{
   if (state->undo_point > 0) {
      // if the 0th undo state has characters, clean those up
      if (state->undo_rec[0].char_storage >= 0) {
         int n = state->undo_rec[0].insert_length, i;
         // delete n characters from all other records
         state->undo_char_point -= n;
         STB_TEXTEDIT_memmove(state->undo_char, state->undo_char + n, (size_t) (state->undo_char_point*sizeof(STB_TEXTEDIT_CHARTYPE)));
         for (i=0; i < state->undo_point; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage -= n; // @OPTIMIZE: get rid of char_storage and infer it
      }
      --state->undo_point;
      STB_TEXTEDIT_memmove(state->undo_rec, state->undo_rec+1, (size_t) (state->undo_point*sizeof(state->undo_rec[0])));
   }
}